

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitLocalSet(BinaryInstWriter *this,LocalSet *curr)

{
  bool bVar1;
  BufferWithRandomAccess *pBVar2;
  mapped_type *pmVar3;
  pair<unsigned_int,_unsigned_int> local_78;
  U32LEB local_70;
  uint local_6c [2];
  Index i_1;
  pair<unsigned_int,_unsigned_int> local_5c;
  U32LEB local_54;
  int local_50;
  pair<unsigned_int,_int> local_4c;
  pair<unsigned_int,_unsigned_int> local_44;
  U32LEB local_3c;
  pair<unsigned_int,_unsigned_int> local_38;
  U32LEB local_30;
  uint local_2c;
  Type TStack_28;
  Index i;
  size_t local_20;
  size_t numValues;
  LocalSet *curr_local;
  BinaryInstWriter *this_local;
  
  numValues = (size_t)curr;
  curr_local = (LocalSet *)this;
  TStack_28 = Function::getLocalType(this->func,curr->index);
  local_20 = wasm::Type::size(&stack0xffffffffffffffd8);
  local_2c = (uint)local_20;
  while (local_2c = local_2c - 1, local_2c != 0) {
    pBVar2 = BufferWithRandomAccess::operator<<(this->o,'!');
    local_38 = std::make_pair<unsigned_int&,unsigned_int&>((uint *)(numValues + 0x10),&local_2c);
    pmVar3 = std::
             unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>
             ::operator[](&this->mappedLocals,&local_38);
    LEB<unsigned_int,_unsigned_char>::LEB(&local_30,(uint)*pmVar3);
    BufferWithRandomAccess::operator<<(pBVar2,local_30);
  }
  bVar1 = LocalSet::isTee((LocalSet *)numValues);
  if (bVar1) {
    pBVar2 = BufferWithRandomAccess::operator<<(this->o,'\"');
    local_6c[1] = 0;
    _i_1 = std::make_pair<unsigned_int&,int>((uint *)(numValues + 0x10),(int *)(local_6c + 1));
    std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_int,_true>
              (&local_5c,(pair<unsigned_int,_int> *)&i_1);
    pmVar3 = std::
             unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>
             ::operator[](&this->mappedLocals,&local_5c);
    LEB<unsigned_int,_unsigned_char>::LEB(&local_54,(uint)*pmVar3);
    BufferWithRandomAccess::operator<<(pBVar2,local_54);
    for (local_6c[0] = 1; local_6c[0] < local_20; local_6c[0] = local_6c[0] + 1) {
      pBVar2 = BufferWithRandomAccess::operator<<(this->o,' ');
      local_78 = std::make_pair<unsigned_int&,unsigned_int&>((uint *)(numValues + 0x10),local_6c);
      pmVar3 = std::
               unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>
               ::operator[](&this->mappedLocals,&local_78);
      LEB<unsigned_int,_unsigned_char>::LEB(&local_70,(uint)*pmVar3);
      BufferWithRandomAccess::operator<<(pBVar2,local_70);
    }
  }
  else {
    pBVar2 = BufferWithRandomAccess::operator<<(this->o,'!');
    local_50 = 0;
    local_4c = std::make_pair<unsigned_int&,int>((uint *)(numValues + 0x10),&local_50);
    std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_int,_true>(&local_44,&local_4c);
    pmVar3 = std::
             unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>
             ::operator[](&this->mappedLocals,&local_44);
    LEB<unsigned_int,_unsigned_char>::LEB(&local_3c,(uint)*pmVar3);
    BufferWithRandomAccess::operator<<(pBVar2,local_3c);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitLocalSet(LocalSet* curr) {
  size_t numValues = func->getLocalType(curr->index).size();
  for (Index i = numValues - 1; i >= 1; --i) {
    o << int8_t(BinaryConsts::LocalSet)
      << U32LEB(mappedLocals[std::make_pair(curr->index, i)]);
  }
  if (!curr->isTee()) {
    o << int8_t(BinaryConsts::LocalSet)
      << U32LEB(mappedLocals[std::make_pair(curr->index, 0)]);
  } else {
    o << int8_t(BinaryConsts::LocalTee)
      << U32LEB(mappedLocals[std::make_pair(curr->index, 0)]);
    for (Index i = 1; i < numValues; ++i) {
      o << int8_t(BinaryConsts::LocalGet)
        << U32LEB(mappedLocals[std::make_pair(curr->index, i)]);
    }
  }
}